

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O3

void apx_vm_writeState_create(apx_vm_writeState_t *self)

{
  if (self != (apx_vm_writeState_t *)0x0) {
    self->parent = (apx_vm_writeState_tag *)0x0;
    adt_str_create(&self->field_name);
    self->index = 0;
    self->array_len = 0;
    self->max_array_len = 0;
    self->element_size = 0;
    self->value_type = DTL_DV_NULL;
    self->scalar_storage_type = '\0';
    self->type_code = '\0';
    self->is_last_field = false;
    self->dynamic_size_type = '\0';
    (self->scalar_value).i32 = 0;
    self->range_check_state = '\0';
  }
  return;
}

Assistant:

void apx_vm_writeState_create(apx_vm_writeState_t* self)
{
   if (self != NULL)
   {
      self->parent = 0u;
      adt_str_create(&self->field_name);
      self->index = 0u;
      self->array_len = 0u;
      self->max_array_len = 0u;
      self->element_size = 0u;
      self->value_type = DTL_DV_NULL;
      self->scalar_storage_type = APX_VM_SCALAR_STORAGE_TYPE_NONE;
      self->type_code = APX_TYPE_CODE_NONE;
      self->is_last_field = false;
      self->dynamic_size_type = APX_SIZE_TYPE_NONE;
      self->range_check_state = APX_RANGE_CHECK_STATE_NOT_CHECKED;
      self->scalar_value.i32 = 0u;
   }
}